

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall
kratos::DependencyVisitor::visit_module_instantiation
          (DependencyVisitor *this,ModuleInstantiationStmt *stmt)

{
  undefined8 *puVar1;
  undefined1 local_58 [8];
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  connection_stmts;
  __alloc_node_gen_t __alloc_node_gen;
  
  connection_stmts._M_h._M_single_bucket = (__node_base_ptr)local_58;
  local_58 = (undefined1  [8])0x0;
  connection_stmts._M_h._M_buckets =
       (__buckets_ptr)(stmt->super_InstantiationStmt).connection_stmt_._M_h._M_bucket_count;
  connection_stmts._M_h._M_bucket_count = 0;
  connection_stmts._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)(stmt->super_InstantiationStmt).connection_stmt_._M_h._M_element_count;
  connection_stmts._M_h._M_element_count =
       *(size_type *)&(stmt->super_InstantiationStmt).connection_stmt_._M_h._M_rehash_policy;
  connection_stmts._M_h._M_rehash_policy._0_8_ =
       (stmt->super_InstantiationStmt).connection_stmt_._M_h._M_rehash_policy._M_next_resize;
  connection_stmts._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  _Hashtable<kratos::AssignStmt*,kratos::AssignStmt*,std::allocator<kratos::AssignStmt*>,std::__detail::_Identity,std::equal_to<kratos::AssignStmt*>,std::hash<kratos::AssignStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<kratos::AssignStmt*,kratos::AssignStmt*,std::allocator<kratos::AssignStmt*>,std::__detail::_Identity,std::equal_to<kratos::AssignStmt*>,std::hash<kratos::AssignStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<kratos::AssignStmt*,false>>>>
            ((_Hashtable<kratos::AssignStmt*,kratos::AssignStmt*,std::allocator<kratos::AssignStmt*>,std::__detail::_Identity,std::equal_to<kratos::AssignStmt*>,std::hash<kratos::AssignStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)connection_stmts._M_h._M_single_bucket,
             &(stmt->super_InstantiationStmt).connection_stmt_._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<kratos::AssignStmt_*,_false>_>_> *
             )&connection_stmts._M_h._M_single_bucket);
  for (puVar1 = (undefined8 *)connection_stmts._M_h._M_bucket_count; puVar1 != (undefined8 *)0x0;
      puVar1 = (undefined8 *)*puVar1) {
    visit_assign(this,(AssignStmt *)puVar1[1]);
  }
  std::
  _Hashtable<kratos::AssignStmt_*,_kratos::AssignStmt_*,_std::allocator<kratos::AssignStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::AssignStmt_*>,_std::hash<kratos::AssignStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::AssignStmt_*,_kratos::AssignStmt_*,_std::allocator<kratos::AssignStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::AssignStmt_*>,_std::hash<kratos::AssignStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_58);
  return;
}

Assistant:

void visit_module_instantiation(ModuleInstantiationStmt *stmt) {
        auto connection_stmts = stmt->connection_stmt();
        for (auto const &assign : connection_stmts) {
            visit_assign(assign);
        }
    }